

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::pwd(void)

{
  char *pcVar1;
  runtime_error *this;
  Path *in_RDI;
  allocator local_1091;
  string local_1090 [55];
  allocator local_1059;
  string local_1058 [32];
  Pathie local_1038 [32];
  char local_1018 [8];
  char cwd [4096];
  
  pcVar1 = getcwd(local_1018,0x1000);
  if (pcVar1 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1058,local_1018,&local_1059);
    filename_to_utf8(local_1038,(string *)local_1058);
    Path(in_RDI,(string *)local_1038);
    std::__cxx11::string::~string((string *)local_1038);
    std::__cxx11::string::~string(local_1058);
    std::allocator<char>::~allocator((allocator<char> *)&local_1059);
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1090,"Failed to retrieve current working directory.",&local_1091);
  std::runtime_error::runtime_error(this,local_1090);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Path Path::pwd()
{
#if defined(_PATHIE_UNIX)
  char cwd[PATH_MAX];
  if (getcwd(cwd, PATH_MAX) != NULL)
    return Path(filename_to_utf8(cwd));
  else
    throw(std::runtime_error("Failed to retrieve current working directory."));
#elif defined(_WIN32)
  wchar_t cwd[MAX_PATH];
  if (GetCurrentDirectoryW(MAX_PATH, cwd) == 0)
    throw(std::runtime_error("Failed to retrieve current working directory."));
  else
    return Path(utf16_to_utf8(std::wstring(cwd)));
#else
#error Unsupported platform.
#endif
}